

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O0

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)

{
  h2o_hostinfo_getaddr_req_t *req_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&queue);
  h2o_linklist_insert(&queue.pending,&req->_pending);
  if ((queue.num_threads_idle == 0) && (queue.num_threads < h2o_hostinfo_max_threads)) {
    create_lookup_thread();
  }
  pthread_cond_signal((pthread_cond_t *)&queue.cond);
  pthread_mutex_unlock((pthread_mutex_t *)&queue);
  return;
}

Assistant:

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)
{
    pthread_mutex_lock(&queue.mutex);

    h2o_linklist_insert(&queue.pending, &req->_pending);

    if (queue.num_threads_idle == 0 && queue.num_threads < h2o_hostinfo_max_threads)
        create_lookup_thread();

    pthread_cond_signal(&queue.cond);
    pthread_mutex_unlock(&queue.mutex);
}